

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O1

void duckdb::FSSTStorage::StringScanPartial<false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  optional_ptr<duckdb::FileBuffer,_true> *this;
  uint uVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  FSSTScanState *scan_state;
  VectorStringBuffer *str_buffer;
  long lVar4;
  ulong uVar5;
  data_ptr_t compressed_string;
  data_ptr_t pdVar6;
  idx_t start;
  idx_t iVar7;
  idx_t iVar8;
  idx_t iVar9;
  anon_union_16_2_67f50693_for_value aVar10;
  bp_delta_offsets_t offsets;
  bp_delta_offsets_t local_68;
  
  scan_state = (FSSTScanState *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  start = state->row_index - (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  this = &(scan_state->super_StringScanState).handle.node;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this);
  pdVar2 = ((scan_state->super_StringScanState).handle.node.ptr)->buffer;
  iVar3 = segment->offset;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this);
  if (scan_count != 0) {
    uVar1 = *(uint *)(((scan_state->super_StringScanState).handle.node.ptr)->buffer +
                     segment->offset + 4);
    pdVar6 = result->data;
    StartScan(&local_68,scan_state,pdVar2 + iVar3 + 0x10,start,scan_count);
    str_buffer = StringVector::GetStringBuffer(result);
    pdVar6 = pdVar6 + result_offset * 0x10 + 8;
    iVar7 = scan_count;
    iVar8 = local_68.scan_offset;
    iVar9 = local_68.unused_delta_decoded_values;
    do {
      uVar5 = (ulong)(scan_state->bitunpack_buffer).
                     super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                     super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                     super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[iVar8];
      lVar4 = (long)(int)(scan_state->delta_decode_buffer).
                         super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t
                         .super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                         .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[iVar9];
      compressed_string = pdVar2 + ((uVar1 + iVar3) - lVar4);
      if (lVar4 == 0) {
        compressed_string = (data_ptr_t)0x0;
      }
      if (uVar5 == 0) {
        uVar5 = 0;
        aVar10 = (anon_union_16_2_67f50693_for_value)ZEXT816(0);
      }
      else {
        if (scan_state->all_values_inlined == true) {
          aVar10.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               FSSTPrimitives::DecompressInlinedValue
                         (scan_state->duckdb_fsst_decoder_ptr,(char *)compressed_string,uVar5);
        }
        else {
          aVar10.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               FSSTPrimitives::DecompressValue
                         (scan_state->duckdb_fsst_decoder_ptr,str_buffer,(char *)compressed_string,
                          uVar5);
        }
        uVar5 = aVar10._0_8_ & 0xffffffff00000000;
      }
      *(ulong *)(pdVar6 + -8) = aVar10.pointer.length | uVar5;
      *(char **)pdVar6 = aVar10.pointer.ptr;
      iVar8 = iVar8 + 1;
      iVar9 = iVar9 + 1;
      pdVar6 = pdVar6 + 0x10;
      iVar7 = iVar7 - 1;
    } while (iVar7 != 0);
    scan_state->last_known_index =
         (scan_state->delta_decode_buffer).
         super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
         [local_68.unused_delta_decoded_values + scan_count + 0xffffffffffffffff];
    scan_state->last_known_row = scan_count + start + -1;
  }
  return;
}

Assistant:

void FSSTStorage::StringScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                                    idx_t result_offset) {

	auto &scan_state = state.scan_state->Cast<FSSTScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	bool enable_fsst_vectors;
	if (ALLOW_FSST_VECTORS) {
		auto &config = DBConfig::GetConfig(segment.db);
		enable_fsst_vectors = config.options.enable_fsst_vectors;
	} else {
		enable_fsst_vectors = false;
	}

	auto baseptr = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto dict = GetDictionary(segment, scan_state.handle);
	auto base_data = data_ptr_cast(baseptr + sizeof(fsst_compression_header_t));
	string_t *result_data;

	if (scan_count == 0) {
		return;
	}

	if (enable_fsst_vectors) {
		D_ASSERT(result_offset == 0);
		if (scan_state.duckdb_fsst_decoder) {
			D_ASSERT(result_offset == 0 || result.GetVectorType() == VectorType::FSST_VECTOR);
			result.SetVectorType(VectorType::FSST_VECTOR);
			auto string_block_limit = StringUncompressed::GetStringBlockLimit(segment.GetBlockManager().GetBlockSize());
			FSSTVector::RegisterDecoder(result, scan_state.duckdb_fsst_decoder, string_block_limit);
			result_data = FSSTVector::GetCompressedData<string_t>(result);
		} else {
			D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
			result_data = FlatVector::GetData<string_t>(result);
		}
	} else {
		D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
		result_data = FlatVector::GetData<string_t>(result);
	}

	auto offsets = StartScan(scan_state, base_data, start, scan_count);
	auto &bitunpack_buffer = scan_state.bitunpack_buffer;
	auto &delta_decode_buffer = scan_state.delta_decode_buffer;
	if (enable_fsst_vectors) {
		// Lookup decompressed offsets in dict
		for (idx_t i = 0; i < scan_count; i++) {
			uint32_t string_length = bitunpack_buffer[i + offsets.scan_offset];
			result_data[i] = UncompressedStringStorage::FetchStringFromDict(
			    segment, dict.end, result, baseptr,
			    UnsafeNumericCast<int32_t>(delta_decode_buffer[i + offsets.unused_delta_decoded_values]),
			    string_length);
			FSSTVector::SetCount(result, scan_count);
		}
	} else {
		// Just decompress
		auto &str_buffer = StringVector::GetStringBuffer(result);
		for (idx_t i = 0; i < scan_count; i++) {
			result_data[i + result_offset] = scan_state.DecompressString(dict, baseptr, offsets, i, str_buffer);
		}
	}
	EndScan(scan_state, offsets, start, scan_count);
}